

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O3

void __thiscall QWidgetEffectSourcePrivate::update(QWidgetEffectSourcePrivate *this)

{
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  
  this->updateDueToGraphicsEffect = true;
  pQVar1 = this->m_widget->data;
  auVar2._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  auVar2._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  auVar2._8_8_ = 0;
  QWidgetPrivate::update<QRect>
            (*(QWidgetPrivate **)&this->m_widget->field_0x8,(QRect)(auVar2 << 0x40));
  this->updateDueToGraphicsEffect = false;
  return;
}

Assistant:

void update() override
    {
        updateDueToGraphicsEffect = true;
        m_widget->update();
        updateDueToGraphicsEffect = false;
    }